

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O2

int calc_dist_dim2(int16_t *p1,int16_t *p2)

{
  int iVar1;
  int i;
  long lVar2;
  
  iVar1 = 0;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    iVar1 = iVar1 + ((int)p1[lVar2] - (int)p2[lVar2]) * ((int)p1[lVar2] - (int)p2[lVar2]);
  }
  return iVar1;
}

Assistant:

static int RENAME(calc_dist)(const int16_t *p1, const int16_t *p2) {
#if AV1_K_MEANS_DIM == 1
  return abs(p1[0] - p2[0]);
#else
  int dist = 0;
  for (int i = 0; i < AV1_K_MEANS_DIM; ++i) {
    const int diff = p1[i] - p2[i];
    dist += diff * diff;
  }
  return dist;
#endif
}